

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> * __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,
          vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *other)

{
  Half *pHVar1;
  size_t sVar2;
  const_reference args;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RSI;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RDI;
  size_t i;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_stack_ffffffffffffffd0;
  size_type sVar3;
  size_type local_20;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_00;
  
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    clear(in_stack_ffffffffffffffd0);
    size(in_RSI);
    reserve(this_00,(size_t)in_RSI);
    local_20 = 0;
    while (sVar3 = local_20, sVar2 = size(in_RSI), sVar3 < sVar2) {
      pHVar1 = in_RDI->ptr;
      args = operator[](in_RSI,local_20);
      pmr::polymorphic_allocator<pbrt::Half>::construct<pbrt::Half,pbrt::Half_const&>
                (&in_RDI->alloc,pHVar1 + local_20,args);
      local_20 = local_20 + 1;
    }
    sVar2 = size(in_RSI);
    in_RDI->nStored = sVar2;
  }
  return in_RDI;
}

Assistant:

vector &operator=(const vector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();

        return *this;
    }